

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

result __thiscall
dtc::anon_unknown_1::binary_operator<7,_dtc::(anonymous_namespace)::lshift<unsigned_long_long>_>::
operator()(binary_operator<7,_dtc::(anonymous_namespace)::lshift<unsigned_long_long>_> *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  unsigned_long_long uVar3;
  byte extraout_DL;
  byte bVar4;
  undefined8 extraout_RDX;
  result rVar5;
  
  iVar1 = (**((this->super_binary_operator_base).lhs._M_t.
              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)
             ->_vptr_expression)();
  iVar2 = (**((this->super_binary_operator_base).rhs._M_t.
              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)
             ->_vptr_expression)();
  bVar4 = (byte)extraout_RDX & extraout_DL;
  rVar5._8_8_ = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar4) & 0xffffffffffffff01;
  uVar3 = 0;
  if ((bVar4 & 1) != 0) {
    uVar3 = CONCAT44(extraout_var,iVar1) << ((byte)iVar2 & 0x3f);
  }
  rVar5.first = uVar3;
  return rVar5;
}

Assistant:

result operator()() override
	{
		Op op;
		result l = (*lhs)();
		result r = (*rhs)();
		if (!(l.second && r.second))
		{
			return {0, false};
		}
		return {op(l.first, r.first), true};
	}